

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64.h
# Opt level: O0

void fiat_25519_cmovznz_u64(uint64_t *out1,fiat_25519_uint1 arg1,uint64_t arg2,uint64_t arg3)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t x3;
  uint64_t x2;
  fiat_25519_uint1 x1;
  uint64_t arg3_local;
  uint64_t arg2_local;
  fiat_25519_uint1 arg1_local;
  uint64_t *out1_local;
  
  uVar1 = fiat_25519_value_barrier_u64((long)-(arg1 != '\0'));
  uVar2 = fiat_25519_value_barrier_u64((long)-(arg1 != '\0') ^ 0xffffffffffffffff);
  *out1 = uVar1 & arg3 | uVar2 & arg2;
  return;
}

Assistant:

static FIAT_25519_FIAT_INLINE void fiat_25519_cmovznz_u64(uint64_t* out1, fiat_25519_uint1 arg1, uint64_t arg2, uint64_t arg3) {
  fiat_25519_uint1 x1;
  uint64_t x2;
  uint64_t x3;
  x1 = (!(!arg1));
  x2 = ((fiat_25519_int1)(0x0 - x1) & UINT64_C(0xffffffffffffffff));
  x3 = ((fiat_25519_value_barrier_u64(x2) & arg3) | (fiat_25519_value_barrier_u64((~x2)) & arg2));
  *out1 = x3;
}